

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O2

string * re2c::genGetCondition_abi_cxx11_(void)

{
  bool bVar1;
  opt_t *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  bVar1 = poVar2->cond_get_naked;
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (bVar1 == true) {
    std::__cxx11::string::string((string *)in_RDI,(string *)&poVar2->cond_get);
  }
  else {
    std::operator+(in_RDI,&poVar2->cond_get,"()");
  }
  return in_RDI;
}

Assistant:

std::string genGetCondition()
{
	return opts->cond_get_naked
		? opts->cond_get
		: opts->cond_get + "()";
}